

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall Preprocessor::Preprocessor(Preprocessor *this,string *prog_path,string *data_path)

{
  size_type *psVar1;
  size_type *psVar2;
  undefined1 *local_120;
  string prog_filename;
  string prog_filename_without_extension;
  string data_filename_without_extension;
  size_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string data_filename;
  
  (this->p_path)._M_dataplus._M_p = (pointer)&(this->p_path).field_2;
  (this->p_path)._M_string_length = 0;
  (this->p_path).field_2._M_local_buf[0] = '\0';
  data_filename_without_extension.field_2._8_8_ = &this->p_A_path;
  (this->p_A_path)._M_dataplus._M_p = (pointer)&(this->p_A_path).field_2;
  (this->p_A_path)._M_string_length = 0;
  (this->p_A_path).field_2._M_local_buf[0] = '\0';
  (this->p_B_path)._M_dataplus._M_p = (pointer)&(this->p_B_path).field_2;
  (this->p_B_path)._M_string_length = 0;
  (this->p_B_path).field_2._M_local_buf[0] = '\0';
  (this->d_path)._M_dataplus._M_p = (pointer)&(this->d_path).field_2;
  (this->d_path)._M_string_length = 0;
  (this->d_path).field_2._M_local_buf[0] = '\0';
  (this->d_A_path)._M_dataplus._M_p = (pointer)&(this->d_A_path).field_2;
  (this->d_A_path)._M_string_length = 0;
  (this->d_A_path).field_2._M_local_buf[0] = '\0';
  (this->d_B_path)._M_dataplus._M_p = (pointer)&(this->d_B_path).field_2;
  (this->d_B_path)._M_string_length = 0;
  (this->d_B_path).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace
            (data_filename_without_extension.field_2._8_8_,0,(char *)0x0,0x104004);
  std::__cxx11::string::_M_replace
            ((ulong)&this->p_B_path,0,(char *)(this->p_B_path)._M_string_length,0x104015);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::find_last_of((char *)prog_path,0x104024,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_120,(ulong)prog_path);
  std::__cxx11::string::rfind((char)&local_120,0x2e);
  std::__cxx11::string::substr((ulong)((long)&prog_filename.field_2 + 8),(ulong)&local_120);
  psVar1 = &data_filename._M_string_length;
  __str_2.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&__str_2.field_2 + 8),prog_filename.field_2._8_8_,
             prog_filename_without_extension._M_dataplus._M_p + prog_filename.field_2._8_8_);
  std::__cxx11::string::append(__str_2.field_2._M_local_buf + 8);
  std::__cxx11::string::_M_append
            ((char *)data_filename_without_extension.field_2._8_8_,__str_2.field_2._8_8_);
  if ((size_type *)__str_2.field_2._8_8_ != psVar1) {
    operator_delete((void *)__str_2.field_2._8_8_,data_filename._M_string_length + 1);
  }
  __str_2.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&__str_2.field_2 + 8),prog_filename.field_2._8_8_,
             prog_filename_without_extension._M_dataplus._M_p + prog_filename.field_2._8_8_);
  std::__cxx11::string::append(__str_2.field_2._M_local_buf + 8);
  std::__cxx11::string::_M_append((char *)&this->p_B_path,__str_2.field_2._8_8_);
  if ((size_type *)__str_2.field_2._8_8_ != psVar1) {
    operator_delete((void *)__str_2.field_2._8_8_,data_filename._M_string_length + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->d_A_path,0,(char *)(this->d_A_path)._M_string_length,0x104004);
  std::__cxx11::string::_M_replace
            ((ulong)&this->d_B_path,0,(char *)(this->d_B_path)._M_string_length,0x104015);
  std::__cxx11::string::_M_assign((string *)&this->d_path);
  std::__cxx11::string::find_last_of((char *)data_path,0x104024,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)((long)&__str_2.field_2 + 8),(ulong)data_path);
  std::__cxx11::string::rfind((char)(&__str_2.field_2._M_allocated_capacity + 1),0x2e);
  std::__cxx11::string::substr
            ((ulong)((long)&prog_filename_without_extension.field_2 + 8),
             (ulong)(&__str_2.field_2._M_allocated_capacity + 1));
  psVar2 = &__str_2._M_string_length;
  local_78 = psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,prog_filename_without_extension.field_2._8_8_,
             data_filename_without_extension._M_dataplus._M_p +
             prog_filename_without_extension.field_2._8_8_);
  std::__cxx11::string::append((char *)&local_78);
  std::__cxx11::string::_M_append((char *)&this->d_A_path,(ulong)local_78);
  if (local_78 != psVar2) {
    operator_delete(local_78,__str_2._M_string_length + 1);
  }
  local_78 = psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,prog_filename_without_extension.field_2._8_8_,
             data_filename_without_extension._M_dataplus._M_p +
             prog_filename_without_extension.field_2._8_8_);
  std::__cxx11::string::append((char *)&local_78);
  std::__cxx11::string::_M_append((char *)&this->d_B_path,(ulong)local_78);
  if (local_78 != psVar2) {
    operator_delete(local_78,__str_2._M_string_length + 1);
  }
  if ((size_type *)prog_filename_without_extension.field_2._8_8_ !=
      &data_filename_without_extension._M_string_length) {
    operator_delete((void *)prog_filename_without_extension.field_2._8_8_,
                    data_filename_without_extension._M_string_length + 1);
  }
  if ((size_type *)__str_2.field_2._8_8_ != psVar1) {
    operator_delete((void *)__str_2.field_2._8_8_,data_filename._M_string_length + 1);
  }
  if ((size_type *)prog_filename.field_2._8_8_ != &prog_filename_without_extension._M_string_length)
  {
    operator_delete((void *)prog_filename.field_2._8_8_,
                    prog_filename_without_extension._M_string_length + 1);
  }
  if ((size_type *)local_120 != &prog_filename._M_string_length) {
    operator_delete(local_120,prog_filename._M_string_length + 1);
  }
  return;
}

Assistant:

Preprocessor::Preprocessor(std::string prog_path, std::string data_path)
{
  p_A_path = "../inputs/alice/";
  p_B_path = "../inputs/bob/";
  p_path = prog_path;
  std::string prog_filename = prog_path.substr(prog_path.find_last_of("/\\") + 1);
  std::string::size_type const p(prog_filename.find_last_of('.'));
  std::string prog_filename_without_extension = prog_filename.substr(0, p);
  p_A_path.append(prog_filename_without_extension + "_A.txt");
  p_B_path.append(prog_filename_without_extension + "_B.txt");

  d_A_path = "../inputs/alice/";
  d_B_path = "../inputs/bob/";
  d_path = data_path;
  std::string data_filename = data_path.substr(data_path.find_last_of("/\\") + 1);
  std::string::size_type const q(data_filename.find_last_of('.'));
  std::string data_filename_without_extension = data_filename.substr(0, q);
  d_A_path.append(data_filename_without_extension + "_A.txt");
  d_B_path.append(data_filename_without_extension + "_B.txt");
  
}